

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packing.cpp
# Opt level: O0

int __thiscall ncnn::Packing::forward(Packing *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  uchar *puVar2;
  long in_RCX;
  Mat *in_RDX;
  Mat *in_RSI;
  Allocator *in_RDI;
  uchar *elem_ptr_2;
  uchar *ptr_2;
  Mat m_1;
  int srck_2;
  int srcq_1;
  int k_2;
  uchar *out_elem_ptr_2;
  int j_2;
  uchar *outptr_2;
  int i_2;
  int z;
  Mat out_1;
  int q_1;
  size_t lane_size_2;
  size_t out_elemsize_3;
  int outc_1;
  uchar *elem_ptr_1;
  uchar *ptr_1;
  Mat m;
  int srck_1;
  int srcq;
  int k_1;
  uchar *out_elem_ptr_1;
  int j_1;
  uchar *outptr_1;
  int i_1;
  Mat out;
  int q;
  size_t lane_size_1;
  size_t out_elemsize_2;
  int outc;
  uchar *elem_ptr;
  uchar *ptr;
  int srck;
  int srcy;
  int k;
  uchar *out_elem_ptr;
  int j;
  uchar *outptr;
  int i;
  size_t lane_size;
  size_t out_elemsize_1;
  int outh;
  size_t out_elemsize;
  int outw;
  size_t elemsize;
  int dims;
  int channels;
  int d;
  int h;
  int w;
  int elempack;
  Mat *in_stack_fffffffffffffd30;
  Mat *this_00;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  size_t in_stack_fffffffffffffd40;
  int _d;
  int _h;
  undefined8 in_stack_fffffffffffffd48;
  int _w;
  Mat *in_stack_fffffffffffffd50;
  Mat *in_stack_fffffffffffffd58;
  Allocator *in_stack_fffffffffffffd68;
  Mat local_288;
  int local_23c;
  int local_238;
  int local_234;
  uchar *local_230;
  int local_224;
  uchar *local_220;
  int local_218;
  int local_214;
  Mat local_210;
  int local_1c4;
  ulong local_1c0;
  ulong local_1b8;
  int local_1ac;
  void **local_1a8;
  void **local_1a0;
  Mat local_198;
  int local_14c;
  int local_148;
  int local_144;
  void **local_140;
  int local_138;
  void **local_128;
  int local_11c;
  Mat local_118;
  int local_cc;
  ulong local_c8;
  ulong local_c0;
  int local_b4;
  uchar *local_b0;
  uchar *local_a8;
  int local_9c;
  int local_98;
  int local_94;
  uchar *local_90;
  int local_84;
  uchar *local_80;
  int local_74;
  ulong local_70;
  ulong local_68;
  int local_5c;
  long local_58;
  int local_4c;
  ulong local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  Mat *local_20;
  Mat *local_18;
  int local_4;
  
  local_2c = in_RSI->elempack;
  if (local_2c == *(int *)&in_RDI[0x1a]._vptr_Allocator) {
    ncnn::Mat::operator=
              ((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
               in_stack_fffffffffffffd30);
    return 0;
  }
  local_30 = in_RSI->w;
  local_34 = in_RSI->h;
  local_38 = in_RSI->d;
  local_3c = in_RSI->c;
  local_40 = in_RSI->dims;
  local_48 = in_RSI->elemsize;
  if (*(int *)((long)&in_RDI[0x1a]._vptr_Allocator + 4) == 0) {
    if ((local_40 == 1) && ((local_30 * local_2c) % *(int *)&in_RDI[0x1a]._vptr_Allocator != 0)) {
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      return 0;
    }
    if ((local_40 == 2) && ((local_34 * local_2c) % *(int *)&in_RDI[0x1a]._vptr_Allocator != 0)) {
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      return 0;
    }
    if (((local_40 == 3) || (local_40 == 4)) &&
       ((local_3c * local_2c) % *(int *)&in_RDI[0x1a]._vptr_Allocator != 0)) {
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      return 0;
    }
  }
  _w = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  local_20 = in_RDX;
  local_18 = in_RSI;
  if (local_40 == 1) {
    if (*(int *)&in_RDI[0x1a]._vptr_Allocator == 1) {
      ncnn::Mat::operator=
                ((Mat *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                 in_stack_fffffffffffffd30);
      local_20->w = local_30 * local_2c;
      local_20->cstep = (long)local_30 * (long)local_2c;
      local_20->elemsize = local_48 / (ulong)(long)local_2c;
      local_20->elempack = *(int *)&in_RDI[0x1a]._vptr_Allocator;
      local_4 = 0;
    }
    else {
      local_4c = (local_30 * local_2c + *(int *)&in_RDI[0x1a]._vptr_Allocator + -1) /
                 *(int *)&in_RDI[0x1a]._vptr_Allocator;
      local_58 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)&in_RDI[0x1a]._vptr_Allocator;
      ncnn::Mat::create(in_stack_fffffffffffffd50,_w,in_stack_fffffffffffffd40,
                        in_stack_fffffffffffffd3c,(Allocator *)in_stack_fffffffffffffd30);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd30);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        memcpy(local_20->data,local_18->data,(long)local_30 * local_48);
        local_4 = 0;
      }
    }
  }
  else {
    _h = (int)in_stack_fffffffffffffd48;
    if (local_40 == 2) {
      local_5c = (local_34 * local_2c + *(int *)&in_RDI[0x1a]._vptr_Allocator + -1) /
                 *(int *)&in_RDI[0x1a]._vptr_Allocator;
      local_68 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)&in_RDI[0x1a]._vptr_Allocator;
      local_70 = local_68 / (ulong)(long)*(int *)&in_RDI[0x1a]._vptr_Allocator;
      ncnn::Mat::create(in_stack_fffffffffffffd50,_w,_h,in_stack_fffffffffffffd40,
                        in_stack_fffffffffffffd3c,(Allocator *)in_stack_fffffffffffffd30);
      bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd30);
      if (bVar1) {
        local_4 = -100;
      }
      else {
        for (local_74 = 0; local_74 < local_5c; local_74 = local_74 + 1) {
          local_80 = ncnn::Mat::operator_cast_to_unsigned_char_(local_20);
          local_80 = local_80 + (long)local_74 * (long)local_30 * local_68;
          for (local_84 = 0; local_84 < local_30; local_84 = local_84 + 1) {
            local_90 = local_80 + (long)local_84 * local_68;
            for (local_94 = 0;
                (local_94 < *(int *)&in_RDI[0x1a]._vptr_Allocator &&
                (local_98 = (local_74 * *(int *)&in_RDI[0x1a]._vptr_Allocator + local_94) / local_2c
                , local_98 < local_34)); local_94 = local_94 + 1) {
              local_9c = (local_74 * *(int *)&in_RDI[0x1a]._vptr_Allocator + local_94) % local_2c;
              local_a8 = ncnn::Mat::operator_cast_to_unsigned_char_(local_18);
              local_a8 = local_a8 + (long)local_98 * (long)local_30 * local_48;
              local_b0 = local_a8 + (long)local_84 * local_48;
              memcpy(local_90 + (long)local_94 * local_70,local_b0 + (long)local_9c * local_70,
                     local_70);
            }
          }
        }
        local_4 = 0;
      }
    }
    else {
      _d = (int)(in_stack_fffffffffffffd40 >> 0x20);
      if (local_40 == 3) {
        local_b4 = (local_3c * local_2c + *(int *)&in_RDI[0x1a]._vptr_Allocator + -1) /
                   *(int *)&in_RDI[0x1a]._vptr_Allocator;
        local_c0 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)&in_RDI[0x1a]._vptr_Allocator;
        local_c8 = local_c0 / (ulong)(long)*(int *)&in_RDI[0x1a]._vptr_Allocator;
        ncnn::Mat::create(in_stack_fffffffffffffd50,_w,_h,_d,
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
                          (int)((ulong)in_stack_fffffffffffffd30 >> 0x20),in_RDI);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd30);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          for (local_cc = 0; local_cc < local_b4; local_cc = local_cc + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffffd58,
                               (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
            for (local_11c = 0; local_11c < local_34; local_11c = local_11c + 1) {
              in_stack_fffffffffffffd58 =
                   (Mat *)ncnn::Mat::operator_cast_to_unsigned_char_(&local_118);
              local_128 = (void **)((long)&in_stack_fffffffffffffd58->data +
                                   (long)local_11c * (long)local_30 * local_c0);
              for (local_138 = 0; local_138 < local_30; local_138 = local_138 + 1) {
                local_140 = (void **)((long)local_128 + (long)local_138 * local_c0);
                for (local_144 = 0;
                    (local_144 < *(int *)&in_RDI[0x1a]._vptr_Allocator &&
                    (local_148 = (local_cc * *(int *)&in_RDI[0x1a]._vptr_Allocator + local_144) /
                                 local_2c, local_148 < local_3c)); local_144 = local_144 + 1) {
                  local_14c = (local_cc * *(int *)&in_RDI[0x1a]._vptr_Allocator + local_144) %
                              local_2c;
                  ncnn::Mat::channel(in_stack_fffffffffffffd58,
                                     (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
                  in_stack_fffffffffffffd50 =
                       (Mat *)ncnn::Mat::operator_cast_to_unsigned_char_(&local_198);
                  local_1a0 = (void **)((long)&in_stack_fffffffffffffd50->data +
                                       (long)local_11c * (long)local_30 * local_48);
                  local_1a8 = (void **)((long)local_1a0 + (long)local_138 * local_48);
                  memcpy((void **)((long)local_140 + (long)local_144 * local_c8),
                         (void **)((long)local_1a8 + (long)local_14c * local_c8),local_c8);
                  ncnn::Mat::~Mat((Mat *)0x6fd8bc);
                }
              }
            }
            ncnn::Mat::~Mat((Mat *)0x6fd932);
          }
          local_4 = 0;
        }
      }
      else if (local_40 == 4) {
        local_1ac = (local_3c * local_2c + *(int *)&in_RDI[0x1a]._vptr_Allocator + -1) /
                    *(int *)&in_RDI[0x1a]._vptr_Allocator;
        local_1b8 = (local_48 / (ulong)(long)local_2c) * (long)*(int *)&in_RDI[0x1a]._vptr_Allocator
        ;
        local_1c0 = local_1b8 / (ulong)(long)*(int *)&in_RDI[0x1a]._vptr_Allocator;
        this_00 = *(Mat **)(in_RCX + 8);
        ncnn::Mat::create(in_stack_fffffffffffffd50,_w,_h,_d,(int)in_stack_fffffffffffffd40,
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),(int)in_RDI,
                          in_stack_fffffffffffffd68);
        bVar1 = ncnn::Mat::empty(this_00);
        if (bVar1) {
          local_4 = -100;
        }
        else {
          for (local_1c4 = 0; local_1c4 < local_1ac; local_1c4 = local_1c4 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffffd58,
                               (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
            for (local_214 = 0; local_214 < local_38; local_214 = local_214 + 1) {
              for (local_218 = 0; local_218 < local_34; local_218 = local_218 + 1) {
                local_220 = ncnn::Mat::operator_cast_to_unsigned_char_(&local_210);
                local_220 = local_220 +
                            (long)(local_214 * local_34 + local_218) * (long)local_30 * local_1b8;
                for (local_224 = 0; local_224 < local_30; local_224 = local_224 + 1) {
                  local_230 = local_220 + (long)local_224 * local_1b8;
                  for (local_234 = 0;
                      (local_234 < *(int *)&in_RDI[0x1a]._vptr_Allocator &&
                      (local_238 = (local_1c4 * *(int *)&in_RDI[0x1a]._vptr_Allocator + local_234) /
                                   local_2c, local_238 < local_3c)); local_234 = local_234 + 1) {
                    local_23c = (local_1c4 * *(int *)&in_RDI[0x1a]._vptr_Allocator + local_234) %
                                local_2c;
                    ncnn::Mat::channel(in_stack_fffffffffffffd58,
                                       (int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
                    puVar2 = ncnn::Mat::operator_cast_to_unsigned_char_(&local_288);
                    memcpy(local_230 + (long)local_234 * local_1c0,
                           puVar2 + (long)local_23c * local_1c0 +
                                    (long)local_224 * local_48 +
                                    (long)(local_214 * local_34 + local_218) * (long)local_30 *
                                    local_48,local_1c0);
                    ncnn::Mat::~Mat((Mat *)0x6fdce8);
                  }
                }
              }
            }
            ncnn::Mat::~Mat((Mat *)0x6fdd73);
          }
          local_4 = 0;
        }
      }
      else {
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

int Packing::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int elempack = bottom_blob.elempack;

    if (elempack == out_elempack)
    {
        top_blob = bottom_blob;
        return 0;
    }

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (!use_padding)
    {
        // identity if use_padding not allowed
        if (dims == 1 && w * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if (dims == 2 && h * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
        if ((dims == 3 || dims == 4) && channels * elempack % out_elempack != 0)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }

    if (dims == 1)
    {
        if (out_elempack == 1)
        {
            top_blob = bottom_blob;
            top_blob.w = w * elempack;
            top_blob.cstep = (size_t)w * elempack;
            top_blob.elemsize = elemsize / elempack;
            top_blob.elempack = out_elempack;
            return 0;
        }

        int outw = (w * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;

        top_blob.create(outw, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        memcpy(top_blob.data, bottom_blob.data, w * elemsize);

        return 0;
    }

    if (dims == 2)
    {
        int outh = (h * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, outh, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < outh; i++)
        {
            unsigned char* outptr = (unsigned char*)top_blob + (size_t)i * w * out_elemsize;

            for (int j = 0; j < w; j++)
            {
                unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                for (int k = 0; k < out_elempack; k++)
                {
                    int srcy = (i * out_elempack + k) / elempack;
                    if (srcy >= h)
                        break;

                    int srck = (i * out_elempack + k) % elempack;

                    const unsigned char* ptr = (const unsigned char*)bottom_blob + (size_t)srcy * w * elemsize;
                    const unsigned char* elem_ptr = ptr + j * elemsize;

                    memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                }
            }
        }

        return 0;
    }

    if (dims == 3)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int i = 0; i < h; i++)
            {
                unsigned char* outptr = (unsigned char*)out + (size_t)i * w * out_elemsize;

                for (int j = 0; j < w; j++)
                {
                    unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                    for (int k = 0; k < out_elempack; k++)
                    {
                        int srcq = (q * out_elempack + k) / elempack;
                        if (srcq >= channels)
                            break;

                        int srck = (q * out_elempack + k) % elempack;

                        const Mat m = bottom_blob.channel(srcq);
                        const unsigned char* ptr = (const unsigned char*)m + (size_t)i * w * elemsize;
                        const unsigned char* elem_ptr = ptr + j * elemsize;

                        memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                    }
                }
            }
        }

        return 0;
    }

    if (dims == 4)
    {
        int outc = (channels * elempack + out_elempack - 1) / out_elempack;
        size_t out_elemsize = elemsize / elempack * out_elempack;
        size_t lane_size = out_elemsize / out_elempack;

        top_blob.create(w, h, d, outc, out_elemsize, out_elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < outc; q++)
        {
            Mat out = top_blob.channel(q);

            for (int z = 0; z < d; z++)
            {
                for (int i = 0; i < h; i++)
                {
                    unsigned char* outptr = (unsigned char*)out + (size_t)(z * h + i) * w * out_elemsize;

                    for (int j = 0; j < w; j++)
                    {
                        unsigned char* out_elem_ptr = outptr + j * out_elemsize;

                        for (int k = 0; k < out_elempack; k++)
                        {
                            int srcq = (q * out_elempack + k) / elempack;
                            if (srcq >= channels)
                                break;

                            int srck = (q * out_elempack + k) % elempack;

                            const Mat m = bottom_blob.channel(srcq);
                            const unsigned char* ptr = (const unsigned char*)m + (size_t)(z * h + i) * w * elemsize;
                            const unsigned char* elem_ptr = ptr + j * elemsize;

                            memcpy(out_elem_ptr + k * lane_size, elem_ptr + srck * lane_size, lane_size);
                        }
                    }
                }
            }
        }

        return 0;
    }

    return 0;
}